

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_internal_impl.hpp
# Opt level: O0

uint __thiscall
unodb::detail::
basic_inode_4<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
::get_insert_pos(basic_inode_4<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
                 *this,uint8_t insert_key_byte,uint node_key_mask)

{
  undefined1 auVar1 [16];
  byte bVar2;
  uint uVar3;
  longlong extraout_RDX;
  undefined7 in_register_00000031;
  longlong lVar5;
  key_union *this_00;
  __m128i y;
  __m128i x;
  uint bit_field;
  __m128i le_node_key_positions;
  __m128i node_keys_in_sse_reg;
  __m128i replicated_insert_key_byte;
  uint node_key_mask_local;
  uint8_t insert_key_byte_local;
  basic_inode_4<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
  *this_local;
  ulong local_58;
  ulong uStack_50;
  ulong uVar4;
  
  lVar5 = CONCAT71(in_register_00000031,insert_key_byte);
  bVar2 = in_fake_critical_section<unsigned_char>::load
                    ((in_fake_critical_section<unsigned_char> *)&this->field_0x8);
  uVar3 = (1 << (bVar2 & 0x1f)) - 1;
  uVar4 = (ulong)uVar3;
  if (node_key_mask == uVar3) {
    auVar1 = vpinsrb_avx(ZEXT116(insert_key_byte),(uint)insert_key_byte,1);
    auVar1 = vpinsrb_avx(auVar1,(uint)insert_key_byte,2);
    auVar1 = vpinsrb_avx(auVar1,(uint)insert_key_byte,3);
    auVar1 = vpinsrb_avx(auVar1,(uint)insert_key_byte,4);
    auVar1 = vpinsrb_avx(auVar1,(uint)insert_key_byte,5);
    auVar1 = vpinsrb_avx(auVar1,(uint)insert_key_byte,6);
    auVar1 = vpinsrb_avx(auVar1,(uint)insert_key_byte,7);
    auVar1 = vpinsrb_avx(auVar1,(uint)insert_key_byte,8);
    auVar1 = vpinsrb_avx(auVar1,(uint)insert_key_byte,9);
    auVar1 = vpinsrb_avx(auVar1,(uint)insert_key_byte,10);
    auVar1 = vpinsrb_avx(auVar1,(uint)insert_key_byte,0xb);
    auVar1 = vpinsrb_avx(auVar1,(uint)insert_key_byte,0xc);
    auVar1 = vpinsrb_avx(auVar1,(uint)insert_key_byte,0xd);
    auVar1 = vpinsrb_avx(auVar1,(uint)insert_key_byte,0xe);
    vpinsrb_avx(auVar1,(uint)insert_key_byte,0xf);
    this_00 = &this->keys;
    uVar3 = in_fake_critical_section<unsigned_int>::load
                      ((in_fake_critical_section<unsigned_int> *)&this_00->byte_array);
    local_58 = (ulong)uVar3;
    uStack_50 = 0;
    y[1] = uVar4;
    y[0] = extraout_RDX;
    x[1] = lVar5;
    x[0] = (longlong)this_00;
    _mm_cmple_epu8(x,y);
    auVar1._8_8_ = uStack_50;
    auVar1._0_8_ = local_58;
    uVar3 = popcount((ushort)((ushort)(SUB161(auVar1 >> 7,0) & 1) |
                              (ushort)(SUB161(auVar1 >> 0xf,0) & 1) << 1 |
                              (ushort)(SUB161(auVar1 >> 0x17,0) & 1) << 2 |
                              (ushort)(SUB161(auVar1 >> 0x1f,0) & 1) << 3 |
                              (ushort)(SUB161(auVar1 >> 0x27,0) & 1) << 4 |
                              (ushort)(SUB161(auVar1 >> 0x2f,0) & 1) << 5 |
                              (ushort)(SUB161(auVar1 >> 0x37,0) & 1) << 6 |
                              (ushort)(SUB161(auVar1 >> 0x3f,0) & 1) << 7 |
                              (ushort)((byte)(uStack_50 >> 7) & 1) << 8 |
                              (ushort)((byte)(uStack_50 >> 0xf) & 1) << 9 |
                              (ushort)((byte)(uStack_50 >> 0x17) & 1) << 10 |
                              (ushort)((byte)(uStack_50 >> 0x1f) & 1) << 0xb |
                              (ushort)((byte)(uStack_50 >> 0x27) & 1) << 0xc |
                              (ushort)((byte)(uStack_50 >> 0x2f) & 1) << 0xd |
                              (ushort)((byte)(uStack_50 >> 0x37) & 1) << 0xe |
                             (ushort)(byte)(uStack_50 >> 0x3f) << 0xf) & node_key_mask);
    return uVar3;
  }
  __assert_fail("node_key_mask == (1U << this->children_count.load()) - 1",
                "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art_internal_impl.hpp"
                ,0x691,
                "auto unodb::detail::basic_inode_4<unodb::detail::basic_art_policy<unsigned long, std::span<const std::byte>, unodb::db, unodb::in_fake_critical_section, unodb::fake_lock, unodb::fake_read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::node_header>, unodb::detail::inode_defs, unodb::detail::db_inode_deleter, unodb::detail::basic_db_leaf_deleter>>::get_insert_pos(std::uint8_t, unsigned int) const [ArtPolicy = unodb::detail::basic_art_policy<unsigned long, std::span<const std::byte>, unodb::db, unodb::in_fake_critical_section, unodb::fake_lock, unodb::fake_read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::node_header>, unodb::detail::inode_defs, unodb::detail::db_inode_deleter, unodb::detail::basic_db_leaf_deleter>]"
               );
}

Assistant:

[[nodiscard]] auto get_insert_pos(std::uint8_t insert_key_byte,
                                    unsigned node_key_mask) const noexcept {
    UNODB_DETAIL_ASSERT(node_key_mask ==
                        (1U << this->children_count.load()) - 1);

    const auto replicated_insert_key_byte =
        _mm_set1_epi8(static_cast<char>(insert_key_byte));
    const auto node_keys_in_sse_reg =
        _mm_cvtsi32_si128(static_cast<std::int32_t>(keys.integer.load()));
    // Since the existing and insert key values cannot be equal, it's OK to use
    // "<=" comparison as "<".
    const auto le_node_key_positions =
        _mm_cmple_epu8(node_keys_in_sse_reg, replicated_insert_key_byte);
    const auto bit_field =
        static_cast<unsigned>(_mm_movemask_epi8(le_node_key_positions)) &
        node_key_mask;
    return detail::popcount(bit_field);
  }